

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absOldRef.c
# Opt level: O2

Vec_Int_t * Saig_ManCexAbstractionFlops(Aig_Man_t *p,Gia_ParAbs_t *pPars)

{
  Vec_Int_t *vFlops;
  Aig_Man_t *p_00;
  Aig_Man_t *p_01;
  int *pnUseStart;
  ulong uVar1;
  int nUseStart;
  int *local_38;
  
  nUseStart = 0;
  if (p->nRegs < 1) {
    __assert_fail("Aig_ManRegNum(p) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/abs/absOldRef.c"
                  ,0x19f,"Vec_Int_t *Saig_ManCexAbstractionFlops(Aig_Man_t *, Gia_ParAbs_t *)");
  }
  if (pPars->fVerbose != 0) {
    puts("Performing counter-example-based refinement.");
  }
  Aig_ManSetCioIds(p);
  vFlops = Vec_IntAlloc(1);
  vFlops->nSize = 1;
  *vFlops->pArray = 0;
  p_00 = Saig_ManDupAbstraction(p,vFlops);
  if (pPars->fVerbose == 0) {
    printf("Init : ");
    Aig_ManPrintStats(p_00);
  }
  puts("Refining abstraction...");
  local_38 = &pPars->Status;
  uVar1 = 0;
  while( true ) {
    pnUseStart = &nUseStart;
    if (pPars->fUseStart == 0) {
      pnUseStart = (int *)0x0;
    }
    p_01 = Saig_ManCexRefine(p,p_00,vFlops,pPars->nFramesBmc,pPars->nConfMaxBmc,pPars->fUseBdds,
                             pPars->fUseDprove,pPars->fVerbose,pnUseStart,local_38,
                             &pPars->nFramesDone);
    if (p_01 == (Aig_Man_t *)0x0) break;
    Aig_ManStop(p_00);
    printf("ITER %4d : ",uVar1);
    if (pPars->fVerbose == 0) {
      Aig_ManPrintStats(p_01);
    }
    Ioa_WriteAiger(p_01,"gabs.aig",0,0);
    uVar1 = (ulong)((int)uVar1 + 1);
    p_00 = p_01;
    if (((double)(p->nRegs - p_01->nRegs) * 100.0) / (double)p->nRegs < (double)pPars->nRatio) {
      printf("Refinements is stopped because flop reduction is less than %d%%\n");
      Aig_ManStop(p_01);
      Vec_IntFree(vFlops);
      return (Vec_Int_t *)0x0;
    }
  }
  if (p->pSeqModel != (Abc_Cex_t *)0x0) {
    free(p->pSeqModel);
    p->pSeqModel = (Abc_Cex_t *)0x0;
  }
  p->pSeqModel = p_00->pSeqModel;
  p_00->pSeqModel = (Abc_Cex_t *)0x0;
  Aig_ManStop(p_00);
  return vFlops;
}

Assistant:

Vec_Int_t * Saig_ManCexAbstractionFlops( Aig_Man_t * p, Gia_ParAbs_t * pPars )
{
    int nUseStart = 0;
    Aig_Man_t * pAbs, * pTemp;
    Vec_Int_t * vFlops;
    int Iter;//, clk = Abc_Clock(), clk2 = Abc_Clock();//, iFlop;
    assert( Aig_ManRegNum(p) > 0 );
    if ( pPars->fVerbose )
        printf( "Performing counter-example-based refinement.\n" );
    Aig_ManSetCioIds( p );
    vFlops = Vec_IntStartNatural( 1 );
/*
    iFlop = Saig_ManFindFirstFlop( p );
    assert( iFlop >= 0 );
    vFlops = Vec_IntAlloc( 1 );
    Vec_IntPush( vFlops, iFlop );
*/
    // create the resulting AIG
    pAbs = Saig_ManDupAbstraction( p, vFlops );
    if ( !pPars->fVerbose )
    {
        printf( "Init : " );
        Aig_ManPrintStats( pAbs );
    }
    printf( "Refining abstraction...\n" );
    for ( Iter = 0; ; Iter++ )
    {
        pTemp = Saig_ManCexRefine( p, pAbs, vFlops, pPars->nFramesBmc, pPars->nConfMaxBmc, pPars->fUseBdds, pPars->fUseDprove, pPars->fVerbose, pPars->fUseStart?&nUseStart:NULL, &pPars->Status, &pPars->nFramesDone );
        if ( pTemp == NULL )
        {
            ABC_FREE( p->pSeqModel );
            p->pSeqModel = pAbs->pSeqModel;
            pAbs->pSeqModel = NULL;
            Aig_ManStop( pAbs );
            break;
        }
        Aig_ManStop( pAbs );
        pAbs = pTemp;
        printf( "ITER %4d : ", Iter );
        if ( !pPars->fVerbose )
            Aig_ManPrintStats( pAbs );
        // output the intermediate result of abstraction
        Ioa_WriteAiger( pAbs, "gabs.aig", 0, 0 );
//            printf( "Intermediate abstracted model was written into file \"%s\".\n", "gabs.aig" );
        // check if the ratio is reached
        if ( 100.0*(Aig_ManRegNum(p)-Aig_ManRegNum(pAbs))/Aig_ManRegNum(p) < 1.0*pPars->nRatio )
        {
            printf( "Refinements is stopped because flop reduction is less than %d%%\n", pPars->nRatio );
            Aig_ManStop( pAbs );
            pAbs = NULL;
            Vec_IntFree( vFlops );
            vFlops = NULL;
            break;
        }
    }
    return vFlops;
}